

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqBroker.cpp
# Opt level: O0

bool __thiscall helics::zeromq::ZmqBroker::brokerConnect(ZmqBroker *this)

{
  bool bVar1;
  NetworkBroker<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0,_1> *in_stack_00000010
  ;
  string *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  this_00 = &local_28;
  std::__cxx11::string::string(in_stack_ffffffffffffffd0);
  ZmqContextManager::startContext(in_stack_00000020);
  std::__cxx11::string::~string(this_00);
  bVar1 = NetworkBroker<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0,_1>::
          brokerConnect(in_stack_00000010);
  return bVar1;
}

Assistant:

bool ZmqBroker::brokerConnect()
    {
        ZmqContextManager::startContext();
        return NetworkBroker::brokerConnect();
    }